

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O3

void __thiscall QGraphicsWidgetPrivate::setWidth(QGraphicsWidgetPrivate *this,qreal w)

{
  long lVar1;
  QGraphicsItem *pQVar2;
  char cVar3;
  QGraphicsItem *pQVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  double local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = qIsNaN(w);
  if (cVar3 == '\0') {
    pQVar2 = (this->super_QGraphicsItemPrivate).q_ptr;
    pQVar4 = pQVar2 + -1;
    if (pQVar2 == (QGraphicsItem *)0x0) {
      pQVar4 = (QGraphicsItem *)0x0;
    }
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(pQVar4 + 2));
    if ((local_30 != w) || (NAN(local_30) || NAN(w))) {
      QGraphicsItem::pos(pQVar4 + 1);
      QVar5 = QGraphicsItem::pos(pQVar4 + 1);
      (*(this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate[0xe])(QVar5.xp,this);
      (*pQVar4->_vptr_QGraphicsItem[0xc])(pQVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::setWidth(qreal w)
{
    if (qIsNaN(w))
        return;
    Q_Q(QGraphicsWidget);
    if (q->geometry().width() == w)
        return;

    q->setGeometry(QRectF(q->x(), q->y(), w, height()));
}